

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O0

bool anon_unknown.dwarf_141291::GlContextImpl::parseVersionString
               (char *version,char *prefix,uint *major,uint *minor)

{
  int iVar1;
  size_t __n;
  size_t sVar2;
  int *in_RCX;
  int *in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t prefixLength;
  
  __n = strlen(in_RSI);
  sVar2 = strlen(in_RDI);
  if ((((__n + 3 <= sVar2) && (iVar1 = strncmp(in_RDI,in_RSI,__n), iVar1 == 0)) &&
      (iVar1 = isdigit((int)in_RDI[__n]), iVar1 != 0)) &&
     ((in_RDI[__n + 1] == '.' && (iVar1 = isdigit((int)in_RDI[__n + 2]), iVar1 != 0)))) {
    *in_RDX = in_RDI[__n] + -0x30;
    *in_RCX = in_RDI[__n + 2] + -0x30;
    return true;
  }
  return false;
}

Assistant:

bool parseVersionString(const char* version, const char* prefix, unsigned int &major, unsigned int &minor)
        {
            std::size_t prefixLength = std::strlen(prefix);

            if ((std::strlen(version) >= (prefixLength + 3)) &&
                (std::strncmp(version, prefix, prefixLength) == 0) &&
                std::isdigit(version[prefixLength]) &&
                (version[prefixLength + 1] == '.') &&
                std::isdigit(version[prefixLength + 2]))
            {
                major = static_cast<unsigned int>(version[prefixLength] - '0');
                minor = static_cast<unsigned int>(version[prefixLength + 2] - '0');

                return true;
            }

            return false;
        }